

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElemSegmentElemExpr_RefNull
          (BinaryReaderInterp *this,Index segment_index)

{
  pointer *ppEVar1;
  pointer pEVar2;
  iterator __position;
  Result RVar3;
  Enum EVar4;
  ElemExpr local_10;
  
  RVar3 = SharedValidator::OnElemSegmentElemExpr_RefNull
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    pEVar2 = (this->module_->elems).
             super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_10.kind = RefNull;
    local_10.index = 0;
    __position._M_current =
         pEVar2[-1].elements.
         super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        pEVar2[-1].elements.
        super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::
      _M_realloc_insert<wabt::interp::ElemExpr>(&pEVar2[-1].elements,__position,&local_10);
    }
    else {
      (__position._M_current)->kind = RefNull;
      (__position._M_current)->index = 0;
      ppEVar1 = &pEVar2[-1].elements.
                 super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppEVar1 = *ppEVar1 + 1;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefNull(Index segment_index) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefNull(loc));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefNull, 0});
  return Result::Ok;
}